

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O0

void Gls_ManStop(Gls_Man_t *p)

{
  Gls_Man_t *p_local;
  
  Vec_StrFree(p->vLines);
  Vec_StrFree(p->vTypes);
  Vec_IntFree(p->vIndexes);
  Vec_IntFree(p->vLut4s);
  Vec_IntFree(p->vLut4TTs);
  Vec_IntFree(p->vLut6s);
  Vec_WrdFree(p->vLut6TTs);
  Vec_IntFree(p->vBoxes);
  Vec_IntFree(p->vDelays);
  Vec_WecFree(p->vDelayIns);
  Vec_WecFree(p->vDelayOuts);
  Vec_IntFree(p->vOrderPis);
  Vec_IntFree(p->vOrderPos);
  Vec_IntFree(p->vOrderBoxes);
  Vec_IntFree(p->vOrderDelays);
  Vec_IntFree(p->vOrderLuts);
  Vec_IntFree(p->vOrderSeqs);
  if (p != (Gls_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Gls_ManStop( Gls_Man_t * p )
{
    Vec_StrFree( p->vLines );
    Vec_StrFree( p->vTypes );
    Vec_IntFree( p->vIndexes );
    Vec_IntFree( p->vLut4s );
    Vec_IntFree( p->vLut4TTs );
    Vec_IntFree( p->vLut6s );
    Vec_WrdFree( p->vLut6TTs );
    Vec_IntFree( p->vBoxes );
    Vec_IntFree( p->vDelays );
    Vec_WecFree( p->vDelayIns );
    Vec_WecFree( p->vDelayOuts );
    // ordering
    Vec_IntFree( p->vOrderPis );
    Vec_IntFree( p->vOrderPos );
    Vec_IntFree( p->vOrderBoxes );
    Vec_IntFree( p->vOrderDelays );
    Vec_IntFree( p->vOrderLuts );
    Vec_IntFree( p->vOrderSeqs );
    ABC_FREE( p );
}